

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ParquetStatisticsUtils::CreateNumericStats
          (ParquetStatisticsUtils *this,LogicalType *type,ParquetColumnSchema *schema_ele,
          Statistics *parquet_stats)

{
  Value max;
  Value min;
  BaseStatistics stats;
  Value aVStack_1b8 [64];
  LogicalType local_178 [24];
  LogicalType local_160 [24];
  LogicalType local_148 [24];
  LogicalType local_130 [24];
  LogicalType local_118 [24];
  Value local_100 [64];
  Value local_c0 [64];
  BaseStatistics local_80 [88];
  
  duckdb::LogicalType::LogicalType(local_118,type);
  duckdb::NumericStats::CreateUnknown(local_80,local_118);
  duckdb::LogicalType::~LogicalType(local_118);
  duckdb::LogicalType::LogicalType(local_130,SQLNULL);
  duckdb::Value::Value(local_c0,local_130);
  duckdb::LogicalType::~LogicalType(local_130);
  duckdb::LogicalType::LogicalType(local_148,SQLNULL);
  duckdb::Value::Value(local_100,local_148);
  duckdb::LogicalType::~LogicalType(local_148);
  if (((byte)parquet_stats->__isset & 0x20) == 0) {
    if (((byte)parquet_stats->__isset & 2) != 0) {
      ConvertValue((ParquetStatisticsUtils *)aVStack_1b8,type,schema_ele,&parquet_stats->min);
      goto LAB_002af3ee;
    }
    duckdb::LogicalType::LogicalType(local_160,type);
    duckdb::Value::Value(aVStack_1b8,local_160);
    duckdb::Value::operator=(local_c0,aVStack_1b8);
    duckdb::Value::~Value(aVStack_1b8);
    duckdb::LogicalType::~LogicalType(local_160);
  }
  else {
    ConvertValue((ParquetStatisticsUtils *)aVStack_1b8,type,schema_ele,&parquet_stats->min_value);
LAB_002af3ee:
    duckdb::Value::operator=(local_c0,aVStack_1b8);
    duckdb::Value::~Value(aVStack_1b8);
  }
  if (((byte)parquet_stats->__isset & 0x10) == 0) {
    if (((byte)parquet_stats->__isset & 1) == 0) {
      duckdb::LogicalType::LogicalType(local_178,type);
      duckdb::Value::Value(aVStack_1b8,local_178);
      duckdb::Value::operator=(local_100,aVStack_1b8);
      duckdb::Value::~Value(aVStack_1b8);
      duckdb::LogicalType::~LogicalType(local_178);
      goto LAB_002af4a0;
    }
    ConvertValue((ParquetStatisticsUtils *)aVStack_1b8,type,schema_ele,&parquet_stats->max);
  }
  else {
    ConvertValue((ParquetStatisticsUtils *)aVStack_1b8,type,schema_ele,&parquet_stats->max_value);
  }
  duckdb::Value::operator=(local_100,aVStack_1b8);
  duckdb::Value::~Value(aVStack_1b8);
LAB_002af4a0:
  duckdb::NumericStats::SetMin(local_80,local_c0);
  duckdb::NumericStats::SetMax(local_80,local_100);
  duckdb::BaseStatistics::ToUnique();
  duckdb::Value::~Value(local_100);
  duckdb::Value::~Value(local_c0);
  duckdb::BaseStatistics::~BaseStatistics(local_80);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> ParquetStatisticsUtils::CreateNumericStats(const LogicalType &type,
                                                                      const ParquetColumnSchema &schema_ele,
                                                                      const duckdb_parquet::Statistics &parquet_stats) {
	auto stats = NumericStats::CreateUnknown(type);

	// for reasons unknown to science, Parquet defines *both* `min` and `min_value` as well as `max` and
	// `max_value`. All are optional. such elegance.
	Value min;
	Value max;
	if (parquet_stats.__isset.min_value) {
		min = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.min_value);
	} else if (parquet_stats.__isset.min) {
		min = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.min);
	} else {
		min = Value(type);
	}
	if (parquet_stats.__isset.max_value) {
		max = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.max_value);
	} else if (parquet_stats.__isset.max) {
		max = ParquetStatisticsUtils::ConvertValue(type, schema_ele, parquet_stats.max);
	} else {
		max = Value(type);
	}
	NumericStats::SetMin(stats, min);
	NumericStats::SetMax(stats, max);
	return stats.ToUnique();
}